

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,off_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Xword EVar1;
  Elf64_Addr EVar2;
  Elf64_Off EVar3;
  Elf64_Xword EVar4;
  Elf64_Xword EVar5;
  ulong uVar6;
  Elf64_Word EVar7;
  Elf64_Word EVar8;
  Elf64_Word EVar9;
  Elf64_Word EVar10;
  ulong uVar11;
  size_t count;
  int iVar12;
  undefined6 in_register_00000032;
  Elf64_Word *pEVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  Elf64_Shdr buf [16];
  undefined1 local_438 [4];
  Elf64_Word local_434 [257];
  
  iVar15 = 0;
  iVar12 = (int)CONCAT62(in_register_00000032,sh_num);
  if (iVar12 == 0) {
    bVar16 = false;
  }
  else {
    do {
      count = (long)(iVar12 - iVar15) << 6;
      if (0x3ff < count) {
        count = 0x400;
      }
      uVar11 = ReadFromOffset(fd,local_438,count,(long)iVar15 * 0x40 + sh_offset);
      bVar16 = uVar11 == 0xffffffffffffffff;
      if (bVar16) {
        type = 0;
        bVar16 = true;
        goto LAB_001181a8;
      }
      if (((uVar11 & 0x3f) != 0) || (0x43f < uVar11)) {
        abort();
      }
      pEVar13 = local_434;
      uVar14 = uVar11 >> 6;
      uVar6 = uVar11;
      while (uVar6 != 0) {
        if (*pEVar13 == type) {
          EVar9 = pEVar13[-1];
          EVar10 = pEVar13[0];
          EVar1 = *(Elf64_Xword *)(pEVar13 + 1);
          EVar2 = *(Elf64_Addr *)(pEVar13 + 3);
          EVar3 = *(Elf64_Off *)(pEVar13 + 5);
          EVar4 = *(Elf64_Xword *)(pEVar13 + 7);
          EVar7 = pEVar13[9];
          EVar8 = pEVar13[10];
          EVar5 = *(Elf64_Xword *)(pEVar13 + 0xd);
          out->sh_addralign = *(Elf64_Xword *)(pEVar13 + 0xb);
          out->sh_entsize = EVar5;
          out->sh_size = EVar4;
          out->sh_link = EVar7;
          out->sh_info = EVar8;
          out->sh_addr = EVar2;
          out->sh_offset = EVar3;
          out->sh_name = EVar9;
          out->sh_type = EVar10;
          out->sh_flags = EVar1;
          bVar16 = true;
          type = 1;
          goto LAB_001181a8;
        }
        pEVar13 = pEVar13 + 0x10;
        uVar14 = uVar14 - 1;
        uVar6 = uVar14;
      }
      iVar15 = iVar15 + (int)(uVar11 >> 6);
    } while (iVar15 < iVar12);
    type = 0;
  }
LAB_001181a8:
  return (bool)(bVar16 & (byte)type);
}

Assistant:

static ATTRIBUTE_NOINLINE bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const off_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (int i = 0; i < sh_num;) {
    const ssize_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const ssize_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_headers_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (int j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}